

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_factory.cc
# Opt level: O2

unique_ptr<sentencepiece::ModelInterface,_std::default_delete<sentencepiece::ModelInterface>_>
__thiscall sentencepiece::ModelFactory::Create(ModelFactory *this,ModelProto *model_proto)

{
  int iVar1;
  _func_int **in_RAX;
  char *pcVar2;
  ostream *poVar3;
  undefined1 *puVar4;
  _func_int **local_18;
  
  puVar4 = (undefined1 *)model_proto->trainer_spec_;
  if ((TrainerSpec *)puVar4 == (TrainerSpec *)0x0) {
    puVar4 = _TrainerSpec_default_instance_;
  }
  local_18 = in_RAX;
  switch(((TrainerSpec *)puVar4)->model_type_) {
  case 1:
    std::make_unique<sentencepiece::unigram::Model,sentencepiece::ModelProto_const&>
              ((ModelProto *)&stack0xffffffffffffffe8);
    break;
  case 2:
    std::make_unique<sentencepiece::bpe::Model,sentencepiece::ModelProto_const&>
              ((ModelProto *)&stack0xffffffffffffffe8);
    break;
  case 3:
    std::make_unique<sentencepiece::word::Model,sentencepiece::ModelProto_const&>
              ((ModelProto *)&stack0xffffffffffffffe8);
    break;
  case 4:
    std::make_unique<sentencepiece::character::Model,sentencepiece::ModelProto_const&>
              ((ModelProto *)&stack0xffffffffffffffe8);
    break;
  default:
    iVar1 = logging::GetMinLogLevel();
    if (iVar1 < 3) {
      local_18 = (_func_int **)((ulong)local_18 & 0xffffffffffffff00);
      pcVar2 = logging::BaseName("third_party/sentencepiece/src/model_factory.cc");
      poVar3 = std::operator<<((ostream *)&std::cerr,pcVar2);
      poVar3 = std::operator<<(poVar3,"(");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x2b);
      poVar3 = std::operator<<(poVar3,") ");
      poVar3 = std::operator<<(poVar3,"LOG(");
      poVar3 = std::operator<<(poVar3,"ERROR");
      poVar3 = std::operator<<(poVar3,") ");
      poVar3 = std::operator<<(poVar3,"Unknown model_type: ");
      std::ostream::operator<<(poVar3,((TrainerSpec *)puVar4)->model_type_);
      error::Die::~Die((Die *)&stack0xffffffffffffffe8);
    }
    *(undefined8 *)this = 0;
    return (__uniq_ptr_data<sentencepiece::ModelInterface,_std::default_delete<sentencepiece::ModelInterface>,_true,_true>
            )(__uniq_ptr_data<sentencepiece::ModelInterface,_std::default_delete<sentencepiece::ModelInterface>,_true,_true>
              )this;
  }
  *(_func_int ***)this = local_18;
  return (__uniq_ptr_data<sentencepiece::ModelInterface,_std::default_delete<sentencepiece::ModelInterface>,_true,_true>
          )(__uniq_ptr_data<sentencepiece::ModelInterface,_std::default_delete<sentencepiece::ModelInterface>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<ModelInterface> ModelFactory::Create(
    const ModelProto& model_proto) {
  const auto& trainer_spec = model_proto.trainer_spec();

  switch (trainer_spec.model_type()) {
    case TrainerSpec::UNIGRAM:
      return std::make_unique<unigram::Model>(model_proto);
      break;
    case TrainerSpec::BPE:
      return std::make_unique<bpe::Model>(model_proto);
      break;
    case TrainerSpec::WORD:
      return std::make_unique<word::Model>(model_proto);
      break;
    case TrainerSpec::CHAR:
      return std::make_unique<character::Model>(model_proto);
      break;
    default:
      LOG(ERROR) << "Unknown model_type: " << trainer_spec.model_type();
      return nullptr;
      break;
  }

  return std::make_unique<unigram::Model>(model_proto);
}